

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O3

int VP8LBackwardReferencesTraceBackwards
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs_src,VP8LBackwardRefs *refs_dst)

{
  ushort uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  int64_t *piVar5;
  CostInterval *pCVar6;
  CostInterval *pCVar7;
  undefined1 auVar8 [16];
  int iVar9;
  CostCacheInterval *cur;
  ushort *ptr;
  uint32_t *output;
  CostManager *manager;
  VP8LHistogram *h;
  CostCacheInterval *pCVar10;
  ulong *puVar11;
  CostInterval *pCVar12;
  ushort *puVar13;
  int iVar14;
  int64_t iVar15;
  CostInterval *pCVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  CostManager *pCVar25;
  uint uVar26;
  uint64_t nmemb;
  uint uVar27;
  ushort *puVar28;
  ushort *puVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  VP8LColorCache hashers;
  VP8LColorCache local_88;
  int local_74;
  uint64_t local_70;
  ulong local_68;
  long local_60;
  VP8LBackwardRefs *local_58;
  VP8LHashChain *local_50;
  CostInterval *local_48;
  uint32_t *local_40;
  CostInterval *local_38;
  
  uVar24 = ysize * xsize;
  local_70 = (uint64_t)(int)uVar24;
  local_50 = hash_chain;
  ptr = (ushort *)WebPSafeMalloc(local_70,2);
  if (ptr == (ushort *)0x0) {
    uVar24 = 0;
    goto LAB_0014c50e;
  }
  iVar9 = (1 << ((byte)cache_bits & 0x1f)) + 0x118;
  if (cache_bits < 1) {
    iVar9 = 0x118;
  }
  local_74 = xsize;
  local_58 = refs_src;
  output = (uint32_t *)WebPSafeCalloc(1,(long)iVar9 * 4 + 0xca8);
  manager = (CostManager *)WebPSafeCalloc(1,0x81c8);
  bVar30 = false;
  if (manager != (CostManager *)0x0 && output != (uint32_t *)0x0) {
    *(uint32_t **)(output + 0x328) = output + 0x32a;
    if (0 < cache_bits) {
      iVar9 = VP8LColorCacheInit(&local_88,cache_bits);
      bVar30 = false;
      if (iVar9 == 0) goto LAB_0014c357;
    }
    h = VP8LAllocateHistogram(cache_bits);
    if (h == (VP8LHistogram *)0x0) {
      bVar30 = false;
      VP8LFreeHistogram((VP8LHistogram *)0x0);
    }
    else {
      VP8LHistogramInit(h,cache_bits,1);
      VP8LHistogramStoreRefs(local_58,VP8LDistanceToPlaneCode,local_74,h);
      iVar9 = (1 << ((byte)h->palette_code_bits & 0x1f)) + 0x118;
      if (h->palette_code_bits < 1) {
        iVar9 = 0x118;
      }
      ConvertPopulationCountTableToBitEstimates(iVar9,h->literal,*(uint32_t **)(output + 0x328));
      ConvertPopulationCountTableToBitEstimates(0x100,h->red,output + 0x100);
      ConvertPopulationCountTableToBitEstimates(0x100,h->blue,output + 0x200);
      ConvertPopulationCountTableToBitEstimates(0x100,h->alpha,output);
      local_40 = output + 0x300;
      ConvertPopulationCountTableToBitEstimates(0x28,h->distance,local_40);
      VP8LFreeHistogram(h);
      manager->costs = (int64_t *)0x0;
      manager->cache_intervals = (CostCacheInterval *)0x0;
      manager->head = (CostInterval *)0x0;
      manager->recycled_intervals = (CostInterval *)0x0;
      manager->count = 0;
      manager->dist_array = ptr;
      local_38 = manager->intervals;
      pCVar12 = (CostInterval *)(manager->cost_cache + 0xffc);
      lVar20 = 10;
      pCVar16 = (CostInterval *)0x0;
      do {
        pCVar12[1].next = pCVar16;
        pCVar12 = pCVar12 + 1;
        lVar20 = lVar20 + -1;
        pCVar16 = pCVar12;
      } while (lVar20 != 0);
      uVar22 = 0xfff;
      if ((int)uVar24 < 0xfff) {
        uVar22 = (ulong)uVar24;
      }
      manager->free_intervals = pCVar12;
      if ((int)uVar24 < 1) {
        manager->cache_intervals_size = 1;
LAB_0014bd1f:
        nmemb = 1;
        bVar30 = false;
      }
      else {
        lVar20 = *(long *)(output + 0x328);
        uVar21 = 0;
        do {
          if (uVar21 < 0x200) {
            uVar27 = (uint)kPrefixEncodeCode[uVar21].code;
            uVar26 = (uint)kPrefixEncodeCode[uVar21].extra_bits;
          }
          else {
            uVar18 = (int)uVar21 - 1;
            uVar27 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> uVar27 == 0; uVar27 = uVar27 - 1) {
              }
            }
            uVar26 = 0x1e - (uVar27 ^ 0x1f);
            uVar27 = (uint)((uVar18 >> (uVar26 & 0x1f) & 1) != 0) + (uVar27 ^ 0x1f) * 2 ^ 0x3e;
          }
          manager->cost_cache[uVar21] =
               (long)(int)uVar26 * 0x800000 +
               (ulong)*(uint *)(lVar20 + 0x400 + (long)(int)uVar27 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar22 != uVar21);
        manager->cache_intervals_size = 1;
        if (uVar24 == 1) goto LAB_0014bd1f;
        nmemb = 1;
        lVar20 = 0;
        iVar15 = manager->cost_cache[0];
        do {
          lVar23 = manager->cost_cache[lVar20 + 1];
          if (lVar23 != iVar15) {
            nmemb = nmemb + 1;
            manager->cache_intervals_size = nmemb;
          }
          lVar20 = lVar20 + 1;
          iVar15 = lVar23;
        } while (uVar22 - 1 != lVar20);
        bVar30 = true;
      }
      pCVar10 = (CostCacheInterval *)WebPSafeMalloc(nmemb,0x10);
      manager->cache_intervals = pCVar10;
      if (pCVar10 != (CostCacheInterval *)0x0) {
        pCVar10->start = 0;
        pCVar10->end = 1;
        iVar15 = manager->cost_cache[0];
        pCVar10->cost = iVar15;
        if (bVar30) {
          lVar20 = 0;
          do {
            lVar23 = manager->cost_cache[lVar20 + 1];
            if (lVar23 != iVar15) {
              pCVar10[1].start = (int)lVar20 + 1;
              pCVar10[1].cost = lVar23;
              pCVar10 = pCVar10 + 1;
            }
            pCVar10->end = (int)lVar20 + 2;
            lVar20 = lVar20 + 1;
            iVar15 = lVar23;
          } while (uVar22 - 1 != lVar20);
        }
        puVar11 = (ulong *)WebPSafeMalloc(local_70,8);
        manager->costs = (int64_t *)puVar11;
        auVar8 = _DAT_001b1a70;
        if (puVar11 != (ulong *)0x0) {
          if (0 < (int)uVar24) {
            lVar20 = local_70 - 1;
            auVar31._8_4_ = (int)lVar20;
            auVar31._0_8_ = lVar20;
            auVar31._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar22 = 0;
            auVar31 = auVar31 ^ _DAT_001b1a70;
            auVar32 = _DAT_001b1880;
            do {
              auVar33 = auVar32 ^ auVar8;
              if ((bool)(~(auVar33._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar33._0_4_ ||
                          auVar31._4_4_ < auVar33._4_4_) & 1)) {
                puVar11[uVar22] = 0x7fffffffffffffff;
              }
              if ((auVar33._12_4_ != auVar31._12_4_ || auVar33._8_4_ <= auVar31._8_4_) &&
                  auVar33._12_4_ <= auVar31._12_4_) {
                puVar11[uVar22 + 1] = 0x7fffffffffffffff;
              }
              uVar22 = uVar22 + 2;
              lVar20 = auVar32._8_8_;
              auVar32._0_8_ = auVar32._0_8_ + 2;
              auVar32._8_8_ = lVar20 + 2;
            } while ((uVar24 + 1 & 0xfffffffe) != uVar22);
          }
          *ptr = 0;
          uVar27 = *argb;
          if (cache_bits < 1) {
LAB_0014bef2:
            lVar20 = ((ulong)output[(ulong)(uVar27 & 0xff) + 0x200] +
                      (ulong)*(uint *)(*(long *)(output + 0x328) + (ulong)(uVar27 >> 8 & 0xff) * 4)
                     + (ulong)*(uint *)((long)output + (ulong)(uVar27 >> 0xe & 0x3fc) + 0x400) +
                       (ulong)output[uVar27 >> 0x18]) * 0x52;
          }
          else {
            uVar18 = uVar27 * 0x1e35a7bd >> ((byte)local_88.hash_shift & 0x1f);
            if (((int)uVar18 < 0) || (local_88.colors[(int)uVar18] != uVar27)) {
              local_88.colors[(int)uVar18] = uVar27;
              goto LAB_0014bef2;
            }
            lVar20 = (ulong)*(uint *)(*(long *)(output + 0x328) + (long)(int)(uVar18 + 0x118) * 4) *
                     0x44;
          }
          uVar22 = (lVar20 + 0x32U) / 100;
          if ((long)uVar22 < (long)*puVar11) {
            *puVar11 = uVar22;
            *ptr = 1;
          }
          if (1 < (int)uVar24) {
            pCVar12 = manager->intervals + 9;
            local_60 = -1;
            iVar9 = -1;
            local_68 = 0;
            uVar22 = 1;
            uVar24 = 0xffffffff;
            uVar27 = 0xffffffff;
            local_48 = pCVar12;
            do {
              puVar4 = local_50->offset_length;
              uVar18 = puVar4[uVar22];
              piVar5 = manager->costs;
              lVar20 = piVar5[uVar22 - 1];
              uVar26 = argb[uVar22];
              if (cache_bits < 1) {
LAB_0014c022:
                lVar23 = ((ulong)output[(ulong)(uVar26 & 0xff) + 0x200] +
                          (ulong)*(uint *)(*(long *)(output + 0x328) +
                                          (ulong)(uVar26 >> 8 & 0xff) * 4) +
                         (ulong)*(uint *)((long)output + (ulong)(uVar26 >> 0xe & 0x3fc) + 0x400) +
                         (ulong)output[uVar26 >> 0x18]) * 0x52;
              }
              else {
                uVar19 = uVar26 * 0x1e35a7bd >> ((byte)local_88.hash_shift & 0x1f);
                if (((int)uVar19 < 0) || (local_88.colors[(int)uVar19] != uVar26)) {
                  local_88.colors[(int)uVar19] = uVar26;
                  goto LAB_0014c022;
                }
                lVar23 = (ulong)*(uint *)(*(long *)(output + 0x328) +
                                         (long)(int)(uVar19 + 0x118) * 4) * 0x44;
              }
              lVar23 = (lVar23 + 0x32U) / 100 + lVar20;
              if (lVar23 < piVar5[uVar22]) {
                piVar5[uVar22] = lVar23;
                ptr[uVar22] = 1;
              }
              uVar26 = uVar18 >> 0xc;
              uVar18 = uVar18 & 0xfff;
              iVar14 = (int)uVar22;
              uVar21 = local_68;
              if (1 < uVar18) {
                if (uVar26 == uVar24) {
                  uVar27 = iVar14 + -2 + uVar27;
                  if (iVar9 == 0) {
                    uVar27 = (uint)local_68;
                  }
                  iVar9 = 0;
                  uVar21 = (ulong)uVar27;
                  if ((int)uVar27 < (int)(iVar14 + uVar18 + -1)) {
                    uVar19 = 0;
                    uVar21 = uVar22 & 0xffffffff;
                    if ((long)uVar22 <= (long)(int)uVar27) {
                      uVar21 = uVar22;
                      do {
                        lVar20 = uVar21 + 1;
                        if (puVar4[lVar20] >> 0xc != uVar24) {
                          uVar19 = puVar4[uVar21 & 0xffffffff] & 0xfff;
                          goto LAB_0014c1ba;
                        }
                        bVar30 = (long)uVar21 < (long)(int)uVar27;
                        uVar21 = uVar21 + 1;
                      } while (bVar30);
                      uVar19 = puVar4[lVar20] & 0xfff;
                      uVar21 = (ulong)(uVar27 + 1);
                    }
LAB_0014c1ba:
                    iVar9 = (int)uVar21;
                    iVar14 = iVar9 + -1;
                    pCVar12 = manager->head;
                    pCVar16 = pCVar12;
                    if (pCVar12 != (CostInterval *)0x0) {
                      do {
                        if (iVar9 <= pCVar16->start) break;
                        pCVar6 = pCVar16->next;
                        if ((iVar9 <= pCVar16->end) && (pCVar16->cost < piVar5[iVar14])) {
                          iVar2 = pCVar16->index;
                          piVar5[iVar14] = pCVar16->cost;
                          manager->dist_array[iVar14] = ((short)iVar14 - (short)iVar2) + 1;
                        }
                        pCVar16 = pCVar6;
                      } while (pCVar6 != (CostInterval *)0x0);
                      uVar17 = uVar21 & 0xffffffff;
                      do {
                        if (iVar9 < pCVar12->start) break;
                        pCVar16 = pCVar12->next;
                        if ((iVar9 < pCVar12->end) && (pCVar12->cost < piVar5[uVar17])) {
                          iVar2 = pCVar12->index;
                          piVar5[uVar17] = pCVar12->cost;
                          manager->dist_array[uVar17] = ((short)uVar21 - (short)iVar2) + 1;
                        }
                        pCVar12 = pCVar16;
                      } while (pCVar16 != (CostInterval *)0x0);
                    }
                    PushInterval(manager,piVar5[iVar14] + local_60,iVar9,uVar19);
                    iVar9 = 0;
                    pCVar12 = local_48;
                    uVar21 = (ulong)(iVar14 + uVar19);
                  }
                }
                else {
                  iVar9 = VP8LDistanceToPlaneCode(local_74,uVar26);
                  if (iVar9 < 0x200) {
                    uVar24 = (uint)kPrefixEncodeCode[iVar9].code;
                    uVar19 = (uint)kPrefixEncodeCode[iVar9].extra_bits;
                  }
                  else {
                    uVar27 = iVar9 - 1;
                    uVar24 = 0x1f;
                    if (uVar27 != 0) {
                      for (; uVar27 >> uVar24 == 0; uVar24 = uVar24 - 1) {
                      }
                    }
                    uVar19 = 0x1e - (uVar24 ^ 0x1f);
                    uVar24 = (uint)((uVar27 >> (uVar19 & 0x1f) & 1) != 0) + (uVar24 ^ 0x1f) * 2 ^
                             0x3e;
                  }
                  local_60 = (long)(int)uVar19 * 0x800000 + (ulong)local_40[(int)uVar24];
                  PushInterval(manager,lVar20 + local_60,iVar14,uVar18);
                  iVar9 = 1;
                  uVar21 = local_68;
                }
              }
              local_68 = uVar21;
              pCVar16 = manager->head;
              while ((pCVar6 = pCVar16, pCVar6 != (CostInterval *)0x0 &&
                     ((long)pCVar6->start <= (long)uVar22))) {
                pCVar16 = pCVar6->next;
                if ((long)uVar22 < (long)pCVar6->end) {
                  if (pCVar6->cost < manager->costs[uVar22]) {
                    iVar14 = pCVar6->index;
                    manager->costs[uVar22] = pCVar6->cost;
                    manager->dist_array[uVar22] = ((short)uVar22 - (short)iVar14) + 1;
                  }
                }
                else {
                  pCVar7 = pCVar6->previous;
                  pCVar25 = (CostManager *)&pCVar7->next;
                  if (pCVar7 == (CostInterval *)0x0) {
                    pCVar25 = manager;
                  }
                  pCVar25->head = pCVar16;
                  if (pCVar16 != (CostInterval *)0x0) {
                    pCVar16->previous = pCVar7;
                  }
                  bVar30 = pCVar12 < pCVar6 || pCVar6 < local_38;
                  pCVar7 = (&manager->free_intervals)[bVar30];
                  (&manager->free_intervals)[bVar30] = pCVar6;
                  pCVar6->next = pCVar7;
                  manager->count = manager->count + -1;
                }
              }
              uVar22 = uVar22 + 1;
              uVar24 = uVar26;
              uVar27 = uVar18;
            } while (uVar22 != local_70);
          }
          bVar30 = local_58->error == 0;
          goto LAB_0014c344;
        }
      }
      CostManagerClear(manager);
      bVar30 = false;
    }
LAB_0014c344:
    if (0 < cache_bits) {
      VP8LColorCacheClear(&local_88);
    }
  }
LAB_0014c357:
  uVar24 = 0;
  CostManagerClear(manager);
  WebPSafeFree(output);
  WebPSafeFree(manager);
  if (bVar30) {
    puVar28 = ptr + local_70;
    puVar29 = puVar28;
    for (puVar13 = ptr + (local_70 - 1); ptr <= puVar13;
        puVar13 = (ushort *)((long)puVar13 - (ulong)((uint)uVar1 * 2))) {
      uVar1 = *puVar13;
      puVar29[-1] = uVar1;
      puVar29 = puVar29 + -1;
    }
    if ((cache_bits < 1) || (iVar9 = VP8LColorCacheInit(&local_88,cache_bits), iVar9 != 0)) {
      VP8LClearBackwardRefs(refs_dst);
      uVar24 = (uint)((ulong)((long)puVar28 - (long)puVar29) >> 1);
      if (0 < (int)uVar24) {
        uVar22 = 0;
        uVar27 = 0;
        do {
          uVar1 = puVar29[uVar22];
          if (uVar1 == 1) {
            if (cache_bits < 1) {
LAB_0014c446:
              uVar18 = argb[uVar27];
              uVar21 = 0x10000;
            }
            else {
              uVar3 = argb[uVar27];
              uVar18 = uVar3 * 0x1e35a7bd >> ((byte)local_88.hash_shift & 0x1f);
              uVar21 = 0x10001;
              if (local_88.colors[(int)uVar18] != uVar3 || (int)uVar18 < 0) {
                local_88.colors[(int)uVar18] = uVar3;
                goto LAB_0014c446;
              }
            }
            VP8LBackwardRefsCursorAdd(refs_dst,(PixOrCopy)((ulong)uVar18 << 0x20 | uVar21));
          }
          else {
            VP8LBackwardRefsCursorAdd
                      (refs_dst,(PixOrCopy)
                                ((ulong)CONCAT42(local_50->offset_length[uVar27] >> 0xc,uVar1) *
                                 0x10000 + 2));
            if ((0 < cache_bits) && (uVar1 != 0)) {
              uVar21 = 0;
              do {
                local_88.colors
                [(int)(argb[uVar27 + uVar21] * 0x1e35a7bd >> ((byte)local_88.hash_shift & 0x1f))] =
                     argb[uVar27 + uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar1 != uVar21);
            }
          }
          uVar27 = uVar27 + uVar1;
          uVar22 = uVar22 + 1;
        } while (uVar22 != (uVar24 & 0x7fffffff));
      }
      bVar30 = refs_dst->error == 0;
      if (0 < cache_bits) {
        VP8LColorCacheClear(&local_88);
      }
    }
    else {
      bVar30 = false;
    }
    uVar24 = (uint)bVar30;
  }
LAB_0014c50e:
  WebPSafeFree(ptr);
  return uVar24;
}

Assistant:

int VP8LBackwardReferencesTraceBackwards(int xsize, int ysize,
                                         const uint32_t* const argb,
                                         int cache_bits,
                                         const VP8LHashChain* const hash_chain,
                                         const VP8LBackwardRefs* const refs_src,
                                         VP8LBackwardRefs* const refs_dst) {
  int ok = 0;
  const int dist_array_size = xsize * ysize;
  uint16_t* chosen_path = NULL;
  int chosen_path_size = 0;
  uint16_t* dist_array =
      (uint16_t*)WebPSafeMalloc(dist_array_size, sizeof(*dist_array));

  if (dist_array == NULL) goto Error;

  if (!BackwardReferencesHashChainDistanceOnly(
          xsize, ysize, argb, cache_bits, hash_chain, refs_src, dist_array)) {
    goto Error;
  }
  TraceBackwards(dist_array, dist_array_size, &chosen_path, &chosen_path_size);
  if (!BackwardReferencesHashChainFollowChosenPath(
          argb, cache_bits, chosen_path, chosen_path_size, hash_chain,
          refs_dst)) {
    goto Error;
  }
  ok = 1;
 Error:
  WebPSafeFree(dist_array);
  return ok;
}